

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

string * __thiscall
OpenMD::XYZVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,XYZVisitor *this)

{
  char buffer [65535];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"Visitor name: %s\n",(this->super_BaseVisitor).visitorName._M_dataplus._M_p
          );
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(buffer,"Visitor Description: assemble the atom data and output xyz file\n",0x41);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string XYZVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(
        buffer, 65535,
        "Visitor Description: assemble the atom data and output xyz file\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }